

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_opt_start(lua_State *L)

{
  int narg;
  int iVar1;
  ulong uVar2;
  jit_State *J_00;
  GCstr *pGVar3;
  jit_State *in_RDI;
  char *unaff_retaddr;
  char *str;
  int i;
  int nargs;
  jit_State *J;
  int local_18;
  
  uVar2 = (ulong)(in_RDI->cur).nins;
  J_00 = (jit_State *)(uVar2 + 0x248);
  narg = (int)(*(long *)&(in_RDI->cur).nk - (long)(in_RDI->cur).ir >> 3);
  if (narg == 0) {
    *(uint *)(uVar2 + 0x2d8) = *(uint *)(uVar2 + 0x2d8) & 0xf000ffff | 0x3ff0000;
  }
  else {
    for (local_18 = 1; local_18 <= narg; local_18 = local_18 + 1) {
      pGVar3 = lj_lib_checkstr((lua_State *)J_00,narg);
      iVar1 = jitopt_level(J_00,(char *)(pGVar3 + 1));
      if (((iVar1 == 0) && (iVar1 = jitopt_flag(in_RDI,(char *)J_00), iVar1 == 0)) &&
         (iVar1 = jitopt_param((jit_State *)str,unaff_retaddr), iVar1 == 0)) {
        lj_err_callerv((lua_State *)in_RDI,LJ_ERR_JITOPT,pGVar3 + 1);
      }
    }
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}